

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::TypeBuilder::dump(TypeBuilder *this)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  HeapType type;
  pointer pHVar2;
  HeapType *extraout_RAX;
  HeapType *extraout_RAX_00;
  HeapType *pHVar3;
  ostream *poVar4;
  undefined1 auVar5 [8];
  HeapType *unaff_R12;
  HeapType *pHVar6;
  size_t i;
  bool bVar7;
  undefined1 local_128 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  _Any_data local_88;
  code *local_78;
  string local_68;
  undefined1 auStack_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  
  auStack_48 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  if (*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) !=
      *(pointer *)
       &((_Var1._M_head_impl)->entries).
        super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
     ) {
    i = 0;
    unaff_R12 = (HeapType *)local_128;
    do {
      local_128 = (undefined1  [8])getTempHeapType(this,i);
      if (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                   (iterator)
                   types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_start,unaff_R12);
      }
      else {
        (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_128;
        types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      i = i + 1;
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    } while (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) -
                         *(long *)&((_Var1._M_head_impl)->entries).
                                   super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
                        >> 4));
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
  IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_128,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
             (DefaultTypeNameGenerator *)local_128,&local_68);
  pHVar3 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    pHVar3 = extraout_RAX_00;
  }
  pHVar2 = types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar7 = false;
  auVar5 = auStack_48;
  while( true ) {
    if (auVar5 == (undefined1  [8])pHVar2) {
      if (((((ulong)unaff_R12 & 1) == 0) && (bVar7 != false)) &&
         (8 < unaff_R12[1].id - unaff_R12->id)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")\n",2);
      }
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&print.fallback);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&print.defaultGenerator.arrayCount);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,
                        (long)types.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
      }
      return;
    }
    type.id = ((pointer)auVar5)->id;
    if (type.id < 0x7d) break;
    pHVar6 = (HeapType *)(type.id | 1);
    if (*(HeapType **)(type.id + 0x20) != (HeapType *)0x0) {
      pHVar6 = *(HeapType **)(type.id + 0x20);
    }
    if ((!bVar7) || (pHVar6 != pHVar3)) {
      if ((((~bVar7 | (byte)pHVar3) & 1) == 0) && (8 < pHVar3[1].id - pHVar3->id)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")\n",2);
      }
      if ((((ulong)pHVar6 & 1) == 0) && (8 < pHVar6[1].id - pHVar6->id)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(rec\n",5);
      }
      pHVar3 = pHVar6;
      if (bVar7 == false) {
        bVar7 = true;
      }
    }
    if ((((ulong)pHVar3 & 1) == 0) && (8 < pHVar3[1].id - pHVar3->id)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
    }
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()((Printed *)&print.names._M_h._M_single_bucket,
               (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_128,type);
    poVar4 = wasm::operator<<((ostream *)&std::cerr,(Printed *)&print.names._M_h._M_single_bucket);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    auVar5 = (undefined1  [8])((long)auVar5 + 8);
    unaff_R12 = pHVar3;
  }
  __assert_fail("!isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x4ed,"RecGroup wasm::HeapType::getRecGroup() const");
}

Assistant:

void TypeBuilder::dump() {
  std::vector<HeapType> types;
  for (size_t i = 0; i < size(); ++i) {
    types.push_back((*this)[i]);
  }
  IndexedTypeNameGenerator<DefaultTypeNameGenerator> print(types);

  std::optional<RecGroup> currGroup;
  for (auto type : types) {
    if (auto newGroup = type.getRecGroup(); newGroup != currGroup) {
      if (currGroup && currGroup->size() > 1) {
        std::cerr << ")\n";
      }
      if (newGroup.size() > 1) {
        std::cerr << "(rec\n";
      }
      currGroup = newGroup;
    }
    if (currGroup->size() > 1) {
      std::cerr << "  ";
    }
    std::cerr << print(type) << "\n";
  }
  if (currGroup && currGroup->size() > 1) {
    std::cerr << ")\n";
  }
}